

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O0

TestObject<256UL,_128UL> * __thiscall
density::
lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)1>
::consume_operation::element<density_tests::TestObject<256ul,128ul>>(consume_operation *this)

{
  LfQueueControl *i_control;
  bool bVar1;
  runtime_type<> *this_00;
  TestObject<256UL,_128UL> *pTVar2;
  consume_operation *this_local;
  
  bVar1 = lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
          ::consume_operation::empty((consume_operation *)this);
  if (!bVar1) {
    this_00 = lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)1>
              ::consume_operation::complete_type((consume_operation *)this);
    bVar1 = runtime_type<>::is<density_tests::TestObject<256ul,128ul>>(this_00);
    if (bVar1) goto LAB_0280e220;
  }
  density_tests::detail::assert_failed<>
            ("!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>()",
             "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/lf_heter_queue.h"
             ,0x410);
LAB_0280e220:
  i_control = *(LfQueueControl **)(this + 8);
  bVar1 = detail::
          LFQueue_Head<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
          ::Consume::external((Consume *)this);
  pTVar2 = (TestObject<256UL,_128UL> *)
           detail::
           LFQueue_Base<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
           ::get_element(i_control,bVar1);
  return pTVar2;
}

Assistant:

COMPLETE_ELEMENT_TYPE & element() const noexcept
            {
                DENSITY_ASSERT(!empty() && complete_type().template is<COMPLETE_ELEMENT_TYPE>());
                return *static_cast<COMPLETE_ELEMENT_TYPE *>(
                  Base::get_element(m_consume_data.m_control, m_consume_data.external()));
            }